

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

void __thiscall cmListCommand::HandleTransformCommand::Command::~Command(Command *this)

{
  pointer pcVar1;
  TransformSelector *pTVar2;
  TransformAction *pTVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  pcVar1 = (this->OutputName)._M_dataplus._M_p;
  paVar4 = &(this->OutputName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pTVar2 = (this->Selector)._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl;
  if (pTVar2 != (TransformSelector *)0x0) {
    (*pTVar2->_vptr_TransformSelector[1])();
  }
  (this->Selector)._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
       (TransformSelector *)0x0;
  pTVar3 = (this->Action)._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
           .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl;
  if (pTVar3 != (TransformAction *)0x0) {
    (*pTVar3->_vptr_TransformAction[1])();
  }
  (this->Action)._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::TransformAction,_std::default_delete<(anonymous_namespace)::TransformAction>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
  .super__Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false>._M_head_impl =
       (TransformAction *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Arguments);
  pcVar1 = (this->ListName)._M_dataplus._M_p;
  paVar4 = &(this->ListName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->Name)._M_dataplus._M_p;
  paVar4 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Command(const std::string& listName)
      : ListName(listName)
      , OutputName(listName)
    {
    }